

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall gguf_writer::pad(gguf_writer *this,size_t alignment)

{
  size_type sVar1;
  gguf_writer *in_RSI;
  undefined8 *in_RDI;
  int8_t zero;
  uint7 in_stack_ffffffffffffffe8;
  
  while( true ) {
    sVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)*in_RDI);
    if (sVar1 % (ulong)in_RSI == 0) break;
    write<signed_char>(in_RSI,(char *)(ulong)in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void pad(const size_t alignment) const {
        while (buf.size() % alignment != 0) {
            const int8_t zero = 0;
            write(zero);
        }
    }